

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O2

void __thiscall
QSyntaxHighlighterPrivate::rehighlight
          (QSyntaxHighlighterPrivate *this,QTextCursor *cursor,MoveOperation operation)

{
  bool bVar1;
  int from;
  int iVar2;
  
  bVar1 = this->inReformatBlocks;
  this->inReformatBlocks = true;
  QTextCursor::beginEditBlock(cursor);
  from = QTextCursor::position(cursor);
  QTextCursor::movePosition(cursor,operation,MoveAnchor,1);
  iVar2 = QTextCursor::position(cursor);
  reformatBlocks(this,from,0,iVar2 - from);
  QTextCursor::endEditBlock(cursor);
  this->inReformatBlocks = bVar1;
  return;
}

Assistant:

inline void rehighlight(QTextCursor &cursor, QTextCursor::MoveOperation operation)
    {
        QScopedValueRollback<bool> bg(inReformatBlocks, true);
        cursor.beginEditBlock();
        int from = cursor.position();
        cursor.movePosition(operation);
        reformatBlocks(from, 0, cursor.position() - from);
        cursor.endEditBlock();
    }